

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::Lookup::selectChild
               (Type *virtualInterface,SourceRange range,
               span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
               selectors,ASTContext *context,LookupResult *result)

{
  SourceRange range_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Symbol *pSVar3;
  undefined8 in_RDX;
  EVP_PKEY_CTX *src;
  undefined8 in_RSI;
  undefined8 *in_stack_00000008;
  LookupResult *in_stack_000000b8;
  ASTContext *in_stack_000000c0;
  bitmask<slang::ast::LookupFlags> in_stack_000000cc;
  undefined1 in_stack_000000d0 [16];
  NamePlusLoc npl;
  add_pointer_t<slang::ast::LookupResult::MemberSelector> memberSel;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *selector;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
  __end2;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
  __begin2;
  reverse_view<std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>
  *__range2;
  Compilation *comp;
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> elementSelects;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  NameComponents unused;
  NamePlusLoc *in_stack_fffffffffffffc78;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *in_stack_fffffffffffffc80;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *in_stack_fffffffffffffc88;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
  *in_stack_fffffffffffffc90;
  ASTContext *in_stack_fffffffffffffca0;
  Type *in_stack_fffffffffffffca8;
  SourceLocation in_stack_fffffffffffffcb0;
  SourceLocation in_stack_fffffffffffffcb8;
  bitmask<slang::ast::LookupFlags> local_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  size_t local_278;
  char *pcStack_270;
  SourceLocation local_268;
  SourceLocation SStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  SourceLocation local_240;
  add_pointer_t<slang::ast::LookupResult::MemberSelector> local_230;
  reference local_228;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  local_210;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  *local_200;
  Compilation *local_1e8;
  SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> local_1e0 [11];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  anon_unknown_39::NameComponents::NameComponents((NameComponents *)in_stack_fffffffffffffc80);
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x653339);
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> *)0x653346);
  local_1e8 = ASTContext::getCompilation((ASTContext *)0x653353);
  local_210 = (span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
               )std::ranges::views::_Reverse::
                operator()<std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_&>
                          ((_Reverse *)in_stack_fffffffffffffc90,
                           (span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                            *)in_stack_fffffffffffffc88);
  local_200 = &local_210;
  std::ranges::
  reverse_view<std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>
  ::begin((reverse_view<std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>
           *)in_stack_fffffffffffffc88);
  std::ranges::
  reverse_view<std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>
  ::end((reverse_view<std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>
         *)in_stack_fffffffffffffc88);
  while( true ) {
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffc90,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffc88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_228 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffffc80);
    local_230 = std::
                get_if<slang::ast::LookupResult::MemberSelector,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                          ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                            *)0x65343f);
    if (local_230 == (add_pointer_t<slang::ast::LookupResult::MemberSelector>)0x0) {
      std::
      get<slang::syntax::ElementSelectSyntax_const*,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  *)0x65357c);
      SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::push_back
                ((SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> *)
                 in_stack_fffffffffffffc80,(ElementSelectSyntax **)in_stack_fffffffffffffc78);
    }
    else {
      anon_unknown_39::NamePlusLoc::NamePlusLoc((NamePlusLoc *)in_stack_fffffffffffffc80);
      local_240 = local_230->dotLocation;
      local_278 = (local_230->name)._M_len;
      pcStack_270 = (local_230->name)._M_str;
      local_268 = (local_230->nameRange).startLoc;
      SStack_260 = (local_230->nameRange).endLoc;
      std::ranges::__reverse_fn::
      operator()<slang::SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>_&>
                ((__reverse_fn *)in_stack_fffffffffffffc90,
                 (SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> *)
                 in_stack_fffffffffffffc88);
      iVar2 = SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::copy
                        (local_1e0,(EVP_PKEY_CTX *)local_1e8,src);
      local_298 = CONCAT44(extraout_var,iVar2);
      std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>
                ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffc90,
                 (span<const_slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL> *)
                 in_stack_fffffffffffffc88);
      local_258 = local_288;
      uStack_250 = uStack_280;
      SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::push_back
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::clear
                ((SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> *)
                 in_stack_fffffffffffffc80);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>_>_>
                  *)in_stack_fffffffffffffc80);
  }
  local_2a8 = local_10;
  uStack_2a0 = uStack_8;
  range_00.endLoc = in_stack_fffffffffffffcb8;
  range_00.startLoc = in_stack_fffffffffffffcb0;
  pSVar3 = anon_unknown_39::getVirtualInterfaceTarget
                     (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,range_00);
  *in_stack_00000008 = pSVar3;
  std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
  span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_2c8 = local_38;
  local_2d8 = local_48;
  uStack_2d0 = uStack_40;
  local_2e8 = local_58;
  uStack_2e0 = uStack_50;
  local_2f8 = local_68;
  uStack_2f0 = uStack_60;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_2fc,None);
  anon_unknown_39::lookupDownward
            ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>)
             in_stack_000000d0,
             (NameComponents)
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>._8_56_,
             in_stack_000000c0,in_stack_000000cc,in_stack_000000b8);
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> *)0x6536d6);
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::~SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x6536e3);
  return;
}

Assistant:

void Lookup::selectChild(const Type& virtualInterface, SourceRange range,
                         std::span<LookupResult::Selector> selectors, const ASTContext& context,
                         LookupResult& result) {
    NameComponents unused;
    SmallVector<NamePlusLoc, 4> nameParts;
    SmallVector<const ElementSelectSyntax*> elementSelects;
    auto& comp = context.getCompilation();

    for (auto& selector : std::views::reverse(selectors)) {
        if (auto memberSel = std::get_if<LookupResult::MemberSelector>(&selector)) {
            NamePlusLoc npl;
            npl.dotLocation = memberSel->dotLocation;
            npl.name.text = memberSel->name;
            npl.name.range = memberSel->nameRange;
            std::ranges::reverse(elementSelects); // reverse the element selects since we initially
                                                  // saw them in reverse order
            npl.name.selectors = elementSelects.copy(comp);

            nameParts.push_back(npl);
            elementSelects.clear();
        }
        else {
            elementSelects.push_back(std::get<const ElementSelectSyntax*>(selector));
        }
    }

    result.found = getVirtualInterfaceTarget(virtualInterface, context, range);
    lookupDownward(nameParts, unused, context, LookupFlags::None, result);
}